

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::AwaitWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  bool bVar1;
  Time t_00;
  bool local_69;
  char *absl_raw_logging_internal_basename;
  bool res;
  KernelTimeout local_38;
  KernelTimeout t;
  Condition *cond_local;
  Mutex *this_local;
  Time deadline_local;
  
  t.ns_ = (int64_t)cond;
  bVar1 = Condition::Eval(cond);
  if (bVar1) {
    AssertReaderHeld(this);
    deadline_local.rep_._15_1_ = 1;
  }
  else {
    t_00.rep_._12_4_ = 0;
    t_00.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
    t_00.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
    synchronization_internal::KernelTimeout::KernelTimeout(&local_38,t_00);
    deadline_local.rep_._15_1_ = AwaitCommon(this,(Condition *)t.ns_,local_38);
    local_69 = true;
    if (!(bool)deadline_local.rep_._15_1_) {
      local_69 = synchronization_internal::KernelTimeout::has_timeout(&local_38);
    }
    if (((local_69 ^ 0xffU) & 1) != 0) {
      raw_logging_internal::RawLog
                (kFatal,"mutex.cc",0x626,"Check %s failed: %s","res || t.has_timeout()",
                 "condition untrue on return from Await");
    }
  }
  return (bool)deadline_local.rep_._15_1_;
}

Assistant:

bool Mutex::AwaitWithDeadline(const Condition &cond, absl::Time deadline) {
  if (cond.Eval()) {      // condition already true; nothing to do
    if (kDebugMode) {
      this->AssertReaderHeld();
    }
    return true;
  }

  KernelTimeout t{deadline};
  bool res = this->AwaitCommon(cond, t);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}